

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServer::WriteParseError(cmServer *this,cmConnection *connection,string *message)

{
  Value *pVVar1;
  cmServer *this_00;
  Value obj;
  Value VStack_d8;
  undefined1 local_b0 [80];
  Value local_60;
  Value local_38;
  
  Json::Value::Value(&VStack_d8,objectValue);
  Json::Value::Value(&local_38,&kERROR_TYPE_abi_cxx11_);
  pVVar1 = Json::Value::operator[](&VStack_d8,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_38);
  Json::Value::~Value(&local_38);
  Json::Value::Value(&local_60,message);
  pVVar1 = Json::Value::operator[](&VStack_d8,&kERROR_MESSAGE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::Value((Value *)(local_b0 + 0x28),"");
  pVVar1 = Json::Value::operator[](&VStack_d8,&kREPLY_TO_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,(Value *)(local_b0 + 0x28));
  Json::Value::~Value((Value *)(local_b0 + 0x28));
  Json::Value::Value((Value *)local_b0,"");
  pVVar1 = Json::Value::operator[](&VStack_d8,&kCOOKIE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,(Value *)local_b0);
  this_00 = (cmServer *)local_b0;
  Json::Value::~Value((Value *)this_00);
  WriteJsonObject(this_00,connection,&VStack_d8,(DebugInfo *)0x0);
  Json::Value::~Value(&VStack_d8);
  return;
}

Assistant:

void cmServer::WriteParseError(cmConnection* connection,
                               const std::string& message) const
{
  Json::Value obj = Json::objectValue;
  obj[kTYPE_KEY] = kERROR_TYPE;
  obj[kERROR_MESSAGE_KEY] = message;
  obj[kREPLY_TO_KEY] = "";
  obj[kCOOKIE_KEY] = "";

  this->WriteJsonObject(connection, obj, nullptr);
}